

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O3

int Abc_NtkClauseTop(sat_solver *pSat,Vec_Ptr_t *vNodes,Vec_Int_t *vVars)

{
  int iVar1;
  long lVar2;
  
  vVars->nSize = 0;
  if (vNodes->nSize < 1) {
    lVar2 = 0;
  }
  else {
    lVar2 = 0;
    do {
      Vec_IntPush(vVars,((uint)vNodes->pArray[lVar2] & 1) +
                        *(int *)(((ulong)vNodes->pArray[lVar2] & 0xfffffffffffffffe) + 0x40) * 2);
      lVar2 = lVar2 + 1;
    } while (lVar2 < vNodes->nSize);
    lVar2 = (long)vVars->nSize;
  }
  iVar1 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + lVar2);
  return iVar1;
}

Assistant:

int Abc_NtkClauseTop( sat_solver * pSat, Vec_Ptr_t * vNodes, Vec_Int_t * vVars )
{
    Abc_Obj_t * pNode;
    int i;
//printf( "Adding triv %d.         %d\n", Abc_ObjRegular(pNode)->Id, (int)pSat->sat_solver_stats.clauses );
    vVars->nSize = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        Vec_IntPush( vVars, toLitCond( (int)(ABC_PTRINT_T)Abc_ObjRegular(pNode)->pCopy, Abc_ObjIsComplement(pNode) ) );
//    Vec_IntPush( vVars, toLitCond( (int)Abc_ObjRegular(pNode)->Id, Abc_ObjIsComplement(pNode) ) );
    return sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
}